

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::setCaseFirst
          (CollationSettings *this,UColAttributeValue value,int32_t defaultOptions,
          UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int32_t noCaseFirst;
  UErrorCode *errorCode_local;
  int32_t defaultOptions_local;
  UColAttributeValue value_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    uVar2 = this->options & 0xfffffcff;
    switch(value) {
    default:
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      break;
    case UCOL_OFF:
      this->options = uVar2;
      break;
    case UCOL_LOWER_FIRST:
      this->options = uVar2 | 0x200;
      break;
    case UCOL_UPPER_FIRST:
      this->options = uVar2 | 0x300;
      break;
    case UCOL_DEFAULT:
      this->options = uVar2 | defaultOptions & 0x300U;
    }
  }
  return;
}

Assistant:

void
CollationSettings::setCaseFirst(UColAttributeValue value,
                                int32_t defaultOptions, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t noCaseFirst = options & ~CASE_FIRST_AND_UPPER_MASK;
    switch(value) {
    case UCOL_OFF:
        options = noCaseFirst;
        break;
    case UCOL_LOWER_FIRST:
        options = noCaseFirst | CASE_FIRST;
        break;
    case UCOL_UPPER_FIRST:
        options = noCaseFirst | CASE_FIRST_AND_UPPER_MASK;
        break;
    case UCOL_DEFAULT:
        options = noCaseFirst | (defaultOptions & CASE_FIRST_AND_UPPER_MASK);
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
    }
}